

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_set_fread(Curl_easy *data,curl_off_t len)

{
  cr_in_ctx *ctx;
  Curl_creader *r;
  curl_off_t cStack_18;
  CURLcode result;
  curl_off_t len_local;
  Curl_easy *data_local;
  
  cStack_18 = len;
  len_local = (curl_off_t)data;
  r._4_4_ = Curl_creader_create((Curl_creader **)&ctx,data,&cr_in,CURL_CR_CLIENT);
  if (r._4_4_ == CURLE_OK) {
    *(curl_off_t *)((long)(ctx->super).ctx + 0x30) = cStack_18;
    cl_reset_reader((Curl_easy *)len_local);
    r._4_4_ = do_init_reader_stack((Curl_easy *)len_local,&ctx->super);
  }
  if ((((len_local != 0) && ((*(ulong *)(len_local + 0xa9a) >> 0x1c & 1) != 0)) &&
      ((*(long *)(len_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(len_local + 0x1328) + 8)))))
     && (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read((Curl_easy *)len_local,"add fread reader, len=%ld -> %d",cStack_18,(ulong)r._4_4_)
    ;
  }
  return r._4_4_;
}

Assistant:

CURLcode Curl_creader_set_fread(struct Curl_easy *data, curl_off_t len)
{
  CURLcode result;
  struct Curl_creader *r;
  struct cr_in_ctx *ctx;

  result = Curl_creader_create(&r, data, &cr_in, CURL_CR_CLIENT);
  if(result)
    goto out;
  ctx = r->ctx;
  ctx->total_len = len;

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
out:
  CURL_TRC_READ(data, "add fread reader, len=%"FMT_OFF_T " -> %d",
                len, result);
  return result;
}